

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventsProcessorTests.cpp
# Opt level: O0

void __thiscall
solitaire::events::
EventsProcessorTests_tryPullOutCardsFromTableauPileOnLeftButtonDownEventOnNotTopCard_Test::TestBody
          (EventsProcessorTests_tryPullOutCardsFromTableauPileOnLeftButtonDownEventOnNotTopCard_Test
           *this)

{
  MockSpec<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
  *this_00;
  TypedExpectation<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
  *this_01;
  size_type sVar1;
  TableauPileMock *this_02;
  Quit local_85;
  Event local_84;
  PileId local_78 [4];
  vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *local_68;
  Action<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
  local_60;
  WithoutMatchers local_39;
  MockSpec<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
  local_38;
  undefined1 local_24 [8];
  variant<solitaire::events::NoEvents,solitaire::events::MouseLeftButtonDown,solitaire::events::MouseLeftButtonUp,solitaire::events::MouseMove,solitaire::events::Quit>
  local_1c [12];
  EventsProcessorTests_tryPullOutCardsFromTableauPileOnLeftButtonDownEventOnNotTopCard_Test
  *local_10;
  EventsProcessorTests_tryPullOutCardsFromTableauPileOnLeftButtonDownEventOnNotTopCard_Test
  *this_local;
  
  local_10 = this;
  std::
  variant<solitaire::events::NoEvents,solitaire::events::MouseLeftButtonDown,solitaire::events::MouseLeftButtonUp,solitaire::events::MouseMove,solitaire::events::Quit>
  ::
  variant<solitaire::events::MouseLeftButtonDown_const&,void,void,solitaire::events::MouseLeftButtonDown,void>
            (local_1c,(MouseLeftButtonDown *)&(anonymous_namespace)::mouseLeftButtonDownEvent);
  EventsProcessorTests::expectEvent(&this->super_EventsProcessorTests,(Event *)local_1c);
  EventsProcessorTests::ignoreLeftButtonDownOnButtons(&this->super_EventsProcessorTests);
  EventsProcessorTests::ignoreLeftButtonDownOnFoundationPilesFromFirstTo
            (&this->super_EventsProcessorTests,4);
  EventsProcessorTests::ignoreLeftButtonDownOnTableauPilesFromFirstTo
            (&this->super_EventsProcessorTests,6);
  piles::PileId::PileId
            ((PileId *)(local_24 + 4),(PileId *)&(anonymous_namespace)::lastTableauPileId);
  EventsProcessorTests::acceptLeftButtonDownOnTableauPileCard
            (&this->super_EventsProcessorTests,(PileId *)(local_24 + 4),2,
             (MouseLeftButtonDown *)&(anonymous_namespace)::mouseLeftButtonDownEvent);
  this_02 = (TableauPileMock *)local_24;
  piles::PileId::PileId((PileId *)this_02,(PileId *)&(anonymous_namespace)::lastTableauPileId);
  EventsProcessorTests::expectGetTableauPileAndItsCollider
            (&this->super_EventsProcessorTests,(PileId *)this_02);
  local_38.function_mocker_ =
       (FunctionMocker<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
        *)piles::TableauPileMock::gmock_getCards
                    ((MockSpec<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
                      *)&(this->super_EventsProcessorTests).tableauPileMock,this_02);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::
            MockSpec<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
            ::operator()(&local_38,&local_39,(void *)0x0);
  this_01 = testing::internal::
            MockSpec<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
            ::InternalExpectedAt
                      (this_00,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/EventsProcessorTests.cpp"
                       ,0x142,"tableauPileMock","getCards()");
  local_68 = (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
             testing::
             ReturnRef<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>const>
                       ((vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
                        (anonymous_namespace)::cards);
  testing::internal::ReturnRefAction::operator_cast_to_Action
            (&local_60,(ReturnRefAction *)&local_68);
  testing::internal::
  TypedExpectation<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
  ::WillOnce(this_01,&local_60);
  testing::
  Action<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>::
  ~Action(&local_60);
  piles::PileId::PileId(local_78,(PileId *)&(anonymous_namespace)::lastTableauPileId);
  sVar1 = std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::size
                    ((vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
                     (anonymous_namespace)::cards);
  EventsProcessorTests::expectTryPullOutCardsFromTableauPile
            (&this->super_EventsProcessorTests,
             (MouseLeftButtonDown *)&(anonymous_namespace)::mouseLeftButtonDownEvent,local_78,2,
             (int)sVar1 - 2);
  std::
  variant<solitaire::events::NoEvents,solitaire::events::MouseLeftButtonDown,solitaire::events::MouseLeftButtonUp,solitaire::events::MouseMove,solitaire::events::Quit>
  ::variant<solitaire::events::Quit,void,void,solitaire::events::Quit,void>
            ((variant<solitaire::events::NoEvents,solitaire::events::MouseLeftButtonDown,solitaire::events::MouseLeftButtonUp,solitaire::events::MouseMove,solitaire::events::Quit>
              *)&local_84,&local_85);
  EventsProcessorTests::expectEvent(&this->super_EventsProcessorTests,&local_84);
  EventsProcessor::processEvents(&(this->super_EventsProcessorTests).eventsProcessor);
  return;
}

Assistant:

TEST_F(EventsProcessorTests,
       tryPullOutCardsFromTableauPileOnLeftButtonDownEventOnNotTopCard)
{
    expectEvent(mouseLeftButtonDownEvent);
    ignoreLeftButtonDownOnButtons();
    ignoreLeftButtonDownOnFoundationPilesFromFirstTo(foundationPilesCount);
    ignoreLeftButtonDownOnTableauPilesFromFirstTo(tableauPilesCount - 1);
    acceptLeftButtonDownOnTableauPileCard(
        lastTableauPileId, middleTableauPileCardIndex, mouseLeftButtonDownEvent);
    expectGetTableauPileAndItsCollider(lastTableauPileId);
    EXPECT_CALL(tableauPileMock, getCards()).WillOnce(ReturnRef(cards));
    expectTryPullOutCardsFromTableauPile(
        mouseLeftButtonDownEvent, lastTableauPileId,
        middleTableauPileCardIndex, cards.size() - middleTableauPileCardIndex);
    expectEvent(Quit {});
    eventsProcessor.processEvents();
}